

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d62_q1c_vector_op.cpp
# Opt level: O1

void reverse(vector<int,_std::allocator<int>_> *v)

{
  int iVar1;
  pointer piVar2;
  pointer piVar3;
  ulong uVar4;
  long lVar5;
  
  piVar3 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  piVar2 = (v->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
  uVar4 = (long)piVar2 - (long)piVar3 >> 2;
  if (1 < uVar4) {
    lVar5 = 0;
    do {
      iVar1 = *piVar3;
      *piVar3 = piVar2[lVar5 + -1];
      piVar2[lVar5 + -1] = iVar1;
      piVar3 = piVar3 + 1;
      lVar5 = lVar5 + -1;
    } while (-lVar5 != uVar4 >> 1);
  }
  return;
}

Assistant:

void reverse(vector<int> &v) {
    for (int i = 0; i < v.size() / 2; i++) {
        swap(v[i], v[v.size() - 1 - i]);
    }
}